

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearray.cpp
# Opt level: O3

QByteArray * __thiscall
QByteArray::repeated(QByteArray *__return_storage_ptr__,QByteArray *this,qsizetype times)

{
  long lVar1;
  Data *pDVar2;
  char *pcVar3;
  ulong uVar4;
  ulong alloc;
  long in_FS_OFFSET;
  QByteArray local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = (this->d).size;
  if (lVar1 == 0) {
    pDVar2 = (this->d).d;
    (__return_storage_ptr__->d).d = pDVar2;
    (__return_storage_ptr__->d).ptr = (this->d).ptr;
    (__return_storage_ptr__->d).size = 0;
LAB_00302126:
    if (pDVar2 != (Data *)0x0) {
      LOCK();
      (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
  }
  else {
    if (times < 2) {
      if (times != 1) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
          (__return_storage_ptr__->d).d = (Data *)0x0;
          (__return_storage_ptr__->d).ptr = (char *)0x0;
          (__return_storage_ptr__->d).size = 0;
          return __return_storage_ptr__;
        }
        goto LAB_003022a2;
      }
      pDVar2 = (this->d).d;
      (__return_storage_ptr__->d).d = pDVar2;
      (__return_storage_ptr__->d).ptr = (this->d).ptr;
      (__return_storage_ptr__->d).size = lVar1;
      goto LAB_00302126;
    }
    alloc = lVar1 * times;
    local_48.d.d = (Data *)0x0;
    local_48.d.ptr = (char *)0x0;
    local_48.d.size = 0;
    reallocData(&local_48,alloc,KeepSize);
    if (&(local_48.d.d)->super_QArrayData == (QArrayData *)0x0) {
      (__return_storage_ptr__->d).d = (Data *)0x0;
      (__return_storage_ptr__->d).ptr = (char *)0x0;
      (__return_storage_ptr__->d).size = 0;
    }
    else {
      uVar4 = *(qsizetype *)((long)local_48.d.d + 8);
      if (uVar4 != 0) {
        *(byte *)&(((ArrayOptions *)((long)local_48.d.d + 4))->
                  super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                  super_QFlagsStorage<QArrayData::ArrayOption>.i =
             (byte)(((ArrayOptions *)((long)local_48.d.d + 4))->
                   super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                   super_QFlagsStorage<QArrayData::ArrayOption>.i | 1;
      }
      if (uVar4 == alloc) {
        pcVar3 = (this->d).ptr;
        if (pcVar3 == (char *)0x0) {
          pcVar3 = &_empty;
        }
        memcpy(local_48.d.ptr,pcVar3,(this->d).size);
        uVar4 = (this->d).size;
        pcVar3 = local_48.d.ptr + uVar4;
        if (uVar4 <= alloc >> 1) {
          do {
            memcpy(pcVar3,local_48.d.ptr,uVar4);
            pcVar3 = pcVar3 + uVar4;
            uVar4 = uVar4 * 2;
          } while ((long)uVar4 <= (long)(alloc >> 1));
        }
        memcpy(pcVar3,local_48.d.ptr,alloc - uVar4);
        local_48.d.ptr[alloc] = '\0';
        (__return_storage_ptr__->d).d = local_48.d.d;
        (__return_storage_ptr__->d).ptr = local_48.d.ptr;
        (__return_storage_ptr__->d).size = alloc;
      }
      else {
        (__return_storage_ptr__->d).d = (Data *)0x0;
        (__return_storage_ptr__->d).ptr = (char *)0x0;
        (__return_storage_ptr__->d).size = 0;
        LOCK();
        ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,1,0x10);
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
LAB_003022a2:
  __stack_chk_fail();
}

Assistant:

QByteArray QByteArray::repeated(qsizetype times) const
{
    if (isEmpty())
        return *this;

    if (times <= 1) {
        if (times == 1)
            return *this;
        return QByteArray();
    }

    const qsizetype resultSize = times * size();

    QByteArray result;
    result.reserve(resultSize);
    if (result.capacity() != resultSize)
        return QByteArray(); // not enough memory

    memcpy(result.d.data(), data(), size());

    qsizetype sizeSoFar = size();
    char *end = result.d.data() + sizeSoFar;

    const qsizetype halfResultSize = resultSize >> 1;
    while (sizeSoFar <= halfResultSize) {
        memcpy(end, result.d.data(), sizeSoFar);
        end += sizeSoFar;
        sizeSoFar <<= 1;
    }
    memcpy(end, result.d.data(), resultSize - sizeSoFar);
    result.d.data()[resultSize] = '\0';
    result.d.size = resultSize;
    return result;
}